

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

void PhyloTree::getCommonEdges
               (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *dest)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a;
  bool bVar1;
  int originalID;
  pointer this;
  pointer this_00;
  int local_dc;
  vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_b8;
  pointer local_b0;
  pointer local_a8;
  Bipartition local_a0;
  PhyloTreeEdge local_78;
  
  local_d8 = (vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)dest;
  std::
  __sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  this = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
         super__Vector_impl_data._M_start;
  local_a8 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  this_00 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_b0 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_b8 = t1_edges;
  do {
    b = &(this_00->super_Bipartition).partition;
    while( true ) {
      if ((this == local_a8) || (this_00 == local_b0)) {
        return;
      }
      a = &(this->super_Bipartition).partition;
      bVar1 = boost::operator<(a,b);
      if (!bVar1) break;
      bVar1 = PhyloTreeEdge::isCompatibleWith(this,t2_edges);
      if (bVar1) {
        PhyloTreeEdge::asSplit(&local_78.super_Bipartition,this);
        local_d0 = PhyloTreeEdge::getAttribute(this);
        local_dc = PhyloTreeEdge::getOriginalID(this);
        std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
        emplace_back<Bipartition,double,int>
                  (local_d8,&local_78.super_Bipartition,&local_d0,&local_dc);
        Bipartition::~Bipartition(&local_78.super_Bipartition);
      }
      this = this + 1;
    }
    bVar1 = boost::operator<(b,a);
    if (bVar1) {
      bVar1 = PhyloTreeEdge::isCompatibleWith(this_00,local_b8);
      if (bVar1) {
        PhyloTreeEdge::asSplit(&local_78.super_Bipartition,this_00);
        local_d0 = PhyloTreeEdge::getAttribute(this_00);
        local_dc = PhyloTreeEdge::getOriginalID(this_00);
        std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
        emplace_back<Bipartition,double,int>
                  (local_d8,&local_78.super_Bipartition,&local_d0,&local_dc);
        Bipartition::~Bipartition(&local_78.super_Bipartition);
      }
    }
    else {
      PhyloTreeEdge::asSplit(&local_a0,this);
      local_c0 = PhyloTreeEdge::getLength(this);
      local_c8 = PhyloTreeEdge::getLength(this_00);
      originalID = PhyloTreeEdge::getOriginalID(this);
      PhyloTreeEdge::PhyloTreeEdge(&local_78,&local_a0,local_c0 - local_c8,originalID);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::emplace_back<PhyloTreeEdge>
                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
      PhyloTreeEdge::~PhyloTreeEdge(&local_78);
      Bipartition::~Bipartition(&local_a0);
      this = this + 1;
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void PhyloTree::getCommonEdges(vector<PhyloTreeEdge> &t1_edges, vector<PhyloTreeEdge> &t2_edges, vector<PhyloTreeEdge> &dest) {
    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    auto first1 = t1_edges.begin();
    auto first2 = t2_edges.begin();
    auto last1 = t1_edges.end();
    auto last2 = t2_edges.end();
    auto common_bkinstr = std::back_inserter(dest);

    while (first1 != last1 && first2 != last2) {
        if (*first1 < *first2) {
            if (first1->isCompatibleWith(t2_edges)) {
                dest.emplace_back(first1->asSplit(), first1->getAttribute(), first1->getOriginalID());
            }
            ++first1; // first1 not in list2
        } else {
            if (!(*first2 < *first1)) { // first1 == first2
                *common_bkinstr++ = std::move(PhyloTreeEdge(first1->asSplit(), first1->getLength() - first2->getLength(), first1->getOriginalID()));
                ++first1;
            }
            else { // first2 not in list1
                if (first2->isCompatibleWith(t1_edges)) {
                    dest.emplace_back(first2->asSplit(), first2->getAttribute(), first2->getOriginalID());
                }
            }
            ++first2;
        }
    }
}